

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O2

void __thiscall
helics::CloneFilterOperation::set(CloneFilterOperation *this,string_view property,double param_2)

{
  InvalidParameter *this_00;
  string_view message;
  allocator<char> local_aa;
  allocator<char> local_a9;
  string_view property_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  property_local._M_str = property._M_str;
  property_local._M_len = property._M_len;
  this_00 = (InvalidParameter *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"property ",&local_a9);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_78,&property_local,&local_aa);
  std::operator+(&local_38,&local_58,&local_78);
  std::operator+(&local_98,&local_38," is not a known property");
  message._M_str = local_98._M_dataplus._M_p;
  message._M_len = local_98._M_string_length;
  InvalidParameter::InvalidParameter(this_00,message);
  __cxa_throw(this_00,&InvalidParameter::typeinfo,HelicsException::~HelicsException);
}

Assistant:

void CloneFilterOperation::set(std::string_view property, double /*val*/)
{
    throw(helics::InvalidParameter(std::string("property ") + std::string(property) +
                                   " is not a known property"));
}